

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O3

CURLcode Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  SessionHandle *pSVar1;
  int iVar2;
  CURLcode CVar3;
  ushort **ppuVar4;
  char *chlg;
  byte bVar5;
  undefined7 in_register_00000031;
  
  pSVar1 = conn->data;
  iVar2 = Curl_raw_nequal("Digest",header,6);
  if (iVar2 == 0) {
    return CURLE_BAD_CONTENT_ENCODING;
  }
  bVar5 = header[6];
  chlg = header + 6;
  if (bVar5 != 0) {
    ppuVar4 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) break;
      bVar5 = chlg[1];
      chlg = chlg + 1;
    } while (bVar5 != 0);
  }
  CVar3 = Curl_sasl_decode_digest_http_message
                    (chlg,(digestdata *)
                          ((long)&(pSVar1->state).digest.nonce +
                          (ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 6)));
  return CVar3;
}

Assistant:

CURLcode Curl_input_digest(struct connectdata *conn,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  struct SessionHandle *data = conn->data;

  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISSPACE(*header))
    header++;

  return Curl_sasl_decode_digest_http_message(header, digest);
}